

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

void LinkLibraryTypeSpecifierWarning(cmMakefile *mf,int left,int right)

{
  char *__s;
  string sStack_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  local_58.View_._M_len = 0x1d;
  local_58.View_._M_str = "Link library type specifier \"";
  __s = *(char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)(uint)left * 8);
  local_88.View_._M_len = strlen(__s);
  local_88.View_._M_str = __s;
  cmStrCat<char[29],char_const*,char[67]>
            (&sStack_a8,&local_58,&local_88,(char (*) [29])"\" is followed by specifier \"",
             (char **)((anonymous_namespace)::LinkLibraryTypeNames + (ulong)(uint)right * 8),
             (char (*) [67])"\" instead of a library name.  The first specifier will be ignored.");
  cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  return;
}

Assistant:

static void LinkLibraryTypeSpecifierWarning(cmMakefile& mf, int left,
                                            int right)
{
  mf.IssueMessage(
    MessageType::AUTHOR_WARNING,
    cmStrCat(
      "Link library type specifier \"", LinkLibraryTypeNames[left],
      "\" is followed by specifier \"", LinkLibraryTypeNames[right],
      "\" instead of a library name.  The first specifier will be ignored."));
}